

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

ostream * __thiscall nivalis::Environment::to_bin(Environment *this,ostream *os)

{
  size_type sVar1;
  ostream *poVar2;
  ostream *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i_1;
  size_t i;
  double in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  ostream *os_00;
  ostream *os_01;
  ostream *this_00;
  ulong local_18;
  
  os_00 = in_RSI;
  std::vector<double,_std::allocator<double>_>::size(in_RDI);
  util::write_bin<unsigned_long>(in_stack_ffffffffffffffb0,(unsigned_long)in_stack_ffffffffffffffa8)
  ;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if (sVar1 <= local_18) break;
    std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_18);
    util::write_bin<double>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_18 = local_18 + 1;
  }
  std::
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>::
  size((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
        *)(in_RDI + 2));
  util::write_bin<unsigned_long>(in_stack_ffffffffffffffb0,(unsigned_long)in_stack_ffffffffffffffa8)
  ;
  os_01 = (ostream *)0x0;
  while( true ) {
    this_00 = os_01;
    poVar2 = (ostream *)
             std::
             vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             ::size((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                     *)(in_RDI + 2));
    if (poVar2 <= os_01) break;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                  *)(in_RDI + 2),(size_type)this_00);
    Expr::to_bin((Expr *)this_00,os_00);
    poVar2 = in_RSI;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                  *)(in_RDI + 2),(size_type)this_00);
    util::write_bin<unsigned_long>(os_01,(unsigned_long)poVar2);
    os_01 = this_00 + 1;
  }
  return in_RSI;
}

Assistant:

std::ostream& Environment::to_bin(std::ostream& os) const {
    util::write_bin(os, vars.size());
    for (size_t i = 0; i < vars.size(); ++i) {
        util::write_bin(os, vars[i]);
    }
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.to_bin(os);
        util::write_bin(os, funcs[i].n_args);
    }
    return os;
}